

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v7::detail::buffer<char>_>
fmt::v7::detail::
write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>
          (back_insert_iterator<fmt::v7::detail::buffer<char>_> out,decimal_fp<float> *fp,
          basic_format_specs<char> *specs,float_specs fspecs,char decimal_point)

{
  bool bVar1;
  type tVar2;
  int *piVar3;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> *pbVar4;
  int local_188;
  int local_184;
  char local_17d;
  int local_17c;
  anon_class_48_6_9afe1116 local_178;
  float_specs local_148;
  int local_13c;
  undefined1 auStack_138 [4];
  int num_zeros;
  sign_t *local_130;
  int *local_128;
  int *local_120;
  char *local_118;
  int *local_110;
  float_specs local_108;
  int local_fc;
  undefined1 auStack_f8 [4];
  int num_zeros_3;
  sign_t *local_f0;
  int *local_e8;
  basic_format_specs<char> *local_e0;
  float_specs *local_d8;
  char *local_d0;
  int *local_c8;
  float_specs local_c0;
  int local_b8;
  int local_b4;
  int num_zeros_2;
  int exp;
  buffer<char> *local_a8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> local_a0;
  float_specs local_98;
  undefined1 local_8c [8];
  anon_class_28_7_94dcc806 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int local_5c;
  undefined1 auStack_58 [4];
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  size_t size;
  sign_t sign;
  int significand_size;
  significand_type significand;
  char decimal_point_local;
  basic_format_specs<char> *specs_local;
  decimal_fp<float> *fp_local;
  float_specs fspecs_local;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_local;
  
  sign = fp->significand;
  significand_size._3_1_ = decimal_point;
  _significand = specs;
  specs_local = (basic_format_specs<char> *)fp;
  fp_local = (decimal_fp<float> *)fspecs;
  fspecs_local = (float_specs)out.container;
  size._4_4_ = get_significand_size<float>(fp);
  size._0_4_ = fp_local._4_4_ >> 8 & 0xff;
  tVar2 = to_unsigned<int>(size._4_4_);
  register0x00000000 = (size_t)(tVar2 + ((sign_t)size != none));
  use_exp_format.fspecs.precision = specs_local->precision + size._4_4_ + -1;
  _auStack_58 = (float_specs)fp_local;
  use_exp_format.fspecs._4_4_ = use_exp_format.fspecs.precision;
  bVar1 = write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
          ::anon_class_12_2_f0c9b3c6::operator()((anon_class_12_2_f0c9b3c6 *)auStack_58);
  if (bVar1) {
    local_5c = 0;
    if ((fp_local._4_4_ >> 0x14 & 1) == 0) {
      if (size._4_4_ == minus) {
        significand_size._3_1_ = '\0';
      }
    }
    else {
      abs_output_exp = (int)fp_local - size._4_4_;
      exp_digits = 0;
      piVar3 = std::max<int>(&abs_output_exp,&exp_digits);
      local_5c = *piVar3;
      tVar2 = to_unsigned<int>(local_5c);
      register0x00000000 = tVar2 + stack0xffffffffffffffb8;
    }
    if ((int)use_exp_format.fspecs._4_4_ < 0) {
      local_17c = -use_exp_format.fspecs._4_4_;
    }
    else {
      local_17c = use_exp_format.fspecs._4_4_;
    }
    write.output_exp = 2;
    if ((99 < local_17c) && (write.output_exp = 3, 999 < local_17c)) {
      write.output_exp = 4;
    }
    tVar2 = to_unsigned<int>((significand_size._3_1_ != '\0') + 2 + write.output_exp);
    register0x00000000 = tVar2 + stack0xffffffffffffffb8;
    local_17d = 'E';
    if (((ulong)fp_local & 0x1000000000000) == 0) {
      local_17d = 'e';
    }
    write._23_1_ = local_17d;
    local_8c._0_4_ = (sign_t)size;
    local_8c._4_4_ = sign;
    write.sign = size._4_4_;
    write.significand._0_1_ = significand_size._3_1_;
    write.significand_size = local_5c;
    write.decimal_point = local_17d;
    write.num_zeros = use_exp_format.fspecs._4_4_;
    if (_significand->width < 1) {
      local_a0.container = (buffer<char> *)fspecs_local;
      pbVar4 = reserve<std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                         ((back_insert_iterator<fmt::v7::detail::buffer<char>_> *)&fspecs_local,
                          register0x00000000);
      _num_zeros_2 = pbVar4->container;
      local_a8 = (buffer<char> *)
                 write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_fmt::v7::detail::dragonbox::decimal_fp<float>,_char>
                 ::anon_class_28_7_94dcc806::operator()
                           ((anon_class_28_7_94dcc806 *)local_8c,_num_zeros_2);
      out_local = base_iterator<std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                            (local_a0,(back_insert_iterator<fmt::v7::detail::buffer<char>_>)local_a8
                            );
    }
    else {
      local_98 = fspecs_local;
      out_local = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_&>
                            ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)fspecs_local,
                             _significand,register0x00000000,(anon_class_28_7_94dcc806 *)local_8c);
    }
  }
  else {
    local_b4 = specs_local->precision + size._4_4_;
    if (specs_local->precision < 0) {
      if (local_b4 < 1) {
        local_13c = -local_b4;
        if (((size._4_4_ == none) && (-1 < (int)fp_local)) && ((int)fp_local < local_13c)) {
          local_13c = (int)fp_local;
        }
        tVar2 = to_unsigned<int>(local_13c);
        register0x00000000 = (tVar2 + 2) + stack0xffffffffffffffb8;
        local_148 = fspecs_local;
        local_178.sign = (sign_t *)&size;
        local_178.num_zeros = &local_13c;
        local_178.significand_size = (int *)((long)&size + 4);
        local_178.fspecs = (float_specs *)&fp_local;
        local_178.decimal_point = (char *)((long)&significand_size + 3);
        local_178.significand = &sign;
        out_local = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_4_>
                              ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)fspecs_local,
                               _significand,register0x00000000,&local_178);
      }
      else {
        if ((fp_local._4_4_ >> 0x14 & 1) == 0) {
          local_184 = 0;
        }
        else {
          local_184 = (int)fp_local - size._4_4_;
        }
        local_fc = local_184;
        if (local_184 < 1) {
          local_188 = 0;
        }
        else {
          local_188 = local_184;
        }
        tVar2 = to_unsigned<int>(local_188);
        register0x00000000 = (tVar2 + 1) + stack0xffffffffffffffb8;
        local_108 = fspecs_local;
        _auStack_138 = (sign_t *)&size;
        local_130 = &sign;
        local_128 = (int *)((long)&size + 4);
        local_120 = &local_b4;
        local_118 = (char *)((long)&significand_size + 3);
        local_110 = &local_fc;
        out_local = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_3_>
                              ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)fspecs_local,
                               _significand,register0x00000000,
                               (anon_class_48_6_48d028d1 *)auStack_138);
      }
    }
    else {
      tVar2 = to_unsigned<int>(specs_local->precision);
      register0x00000000 = tVar2 + stack0xffffffffffffffb8;
      local_b8 = (int)fp_local - local_b4;
      if ((fp_local._4_4_ >> 0x14 & 1) != 0) {
        if ((local_b8 < 1) && ((char)((ulong)fp_local >> 0x20) != '\x02')) {
          local_b8 = 1;
        }
        if (0 < local_b8) {
          tVar2 = to_unsigned<int>(local_b8);
          register0x00000000 = tVar2 + stack0xffffffffffffffb8;
        }
      }
      local_c0 = fspecs_local;
      _auStack_f8 = (sign_t *)&size;
      local_f0 = &sign;
      local_e8 = (int *)((long)&size + 4);
      local_e0 = specs_local;
      local_d8 = (float_specs *)&fp_local;
      local_d0 = (char *)((long)&significand_size + 3);
      local_c8 = &local_b8;
      out_local = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_float<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>,char>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::detail::dragonbox::decimal_fp<float>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_2_>
                            ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)fspecs_local,
                             _significand,stack0xffffffffffffffb8,
                             (anon_class_56_7_a2a26a24 *)auStack_f8);
    }
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)out_local.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}